

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildElementSlot
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,int32 slotIndex,RegSlot value,
          RegSlot instance)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  IndirOpnd *src1Opnd;
  RegOpnd *pRVar5;
  RegOpnd *dstOpnd;
  SymOpnd *pSVar6;
  RegOpnd *pRVar7;
  RegOpnd *indexOpnd_1;
  RegOpnd *baseOpnd_1;
  IndirOpnd *indirOpnd;
  RegOpnd *indexOpnd;
  RegOpnd *baseOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  IRType local_45;
  Types TStack_44;
  bool isStore;
  ValueType valueType;
  IRType irType;
  Types type;
  Instr *instr;
  RegOpnd *regOpnd;
  Opnd *slotOpnd;
  RegSlot valueRegSlot;
  RegSlot instance_local;
  RegSlot value_local;
  int32 slotIndex_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  bVar2 = OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x4c9,"(OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (((instance != 1) && (newOpcode != LdArr_Func)) && (newOpcode != LdArr_WasmFunc)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x4cb,
                       "(instance == 1 || newOpcode == Js::OpCodeAsmJs::LdArr_Func || newOpcode == Js::OpCodeAsmJs::LdArr_WasmFunc)"
                       ,
                       "instance == 1 || newOpcode == Js::OpCodeAsmJs::LdArr_Func || newOpcode == Js::OpCodeAsmJs::LdArr_WasmFunc"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  _valueType = (Instr *)0x0;
  ValueType::ValueType((ValueType *)&local_48.field_0);
  if (newOpcode == LdSlotArr) {
    RVar3 = GetRegSlotFromPtrReg(this,value);
    pSVar6 = BuildFieldOpnd(this,1,slotIndex,PropertyKindSlots,TyVar,true);
    pRVar7 = BuildDstOpnd(this,RVar3,TyInt64);
    _valueType = IR::Instr::New(LdSlot,&pRVar7->super_Opnd,&pSVar6->super_Opnd,this->m_func);
    goto LAB_0069079b;
  }
  if (newOpcode == LdSlot) {
    RVar3 = GetRegSlotFromPtrReg(this,value);
    pSVar6 = BuildFieldOpnd(this,1,slotIndex,PropertyKindSlotArray,TyVar,true);
    pRVar7 = BuildDstOpnd(this,RVar3,TyInt64);
    _valueType = IR::Instr::New(LdSlot,&pRVar7->super_Opnd,&pSVar6->super_Opnd,this->m_func);
    goto LAB_0069079b;
  }
  if (newOpcode == LdSlot_Db) {
LAB_0069051b:
    TStack_44 = FLOAT64;
    local_45 = TyFloat64;
    local_48 = ValueType::Float.field_0;
    bVar2 = newOpcode == StSlot_Db;
  }
  else if (newOpcode == LdSlot_Int) {
LAB_00690490:
    TStack_44 = INT32;
    local_45 = TyInt32;
    local_48.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
    bVar2 = newOpcode == StSlot_Int;
  }
  else if (newOpcode == LdSlot_Long) {
LAB_006904c0:
    TStack_44 = INT64;
    local_45 = TyInt64;
    local_48.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
    bVar2 = newOpcode == StSlot_Long;
  }
  else if (newOpcode == LdSlot_Flt) {
LAB_006904f0:
    TStack_44 = FLOAT32;
    local_45 = TyFloat32;
    local_48 = ValueType::Float.field_0;
    bVar2 = newOpcode == StSlot_Flt;
  }
  else {
    if (newOpcode == StSlot_Db) goto LAB_0069051b;
    if (newOpcode == StSlot_Int) goto LAB_00690490;
    if (newOpcode == StSlot_Long) goto LAB_006904c0;
    if (newOpcode == StSlot_Flt) goto LAB_006904f0;
    if (newOpcode == LdArr_Func) {
      RVar3 = GetRegSlotFromPtrReg(this,instance);
      pRVar7 = BuildSrcOpnd(this,RVar3,TyInt64);
      RVar3 = GetRegSlotFromIntReg(this,slotIndex);
      pRVar5 = BuildSrcOpnd(this,RVar3,TyUint32);
      src1Opnd = IR::IndirOpnd::New(pRVar7,pRVar5,TyInt64,this->m_func);
      RVar3 = GetRegSlotFromPtrReg(this,value);
      pRVar7 = BuildDstOpnd(this,RVar3,TyInt64);
      _valueType = IR::Instr::New(LdAsmJsFunc,&pRVar7->super_Opnd,&src1Opnd->super_Opnd,this->m_func
                                 );
      goto LAB_0069079b;
    }
    if (newOpcode == LdArr_WasmFunc) {
      RVar3 = GetRegSlotFromPtrReg(this,instance);
      pRVar7 = BuildSrcOpnd(this,RVar3,TyInt64);
      RVar3 = GetRegSlotFromIntReg(this,slotIndex);
      pRVar5 = BuildSrcOpnd(this,RVar3,TyUint32);
      RVar3 = GetRegSlotFromPtrReg(this,value);
      dstOpnd = BuildDstOpnd(this,RVar3,TyInt64);
      _valueType = IR::Instr::New(LdWasmFunc,&dstOpnd->super_Opnd,&pRVar7->super_Opnd,
                                  &pRVar5->super_Opnd,this->m_func);
      goto LAB_0069079b;
    }
    if ((ushort)(newOpcode - Simd128_LdSlot_I4) < 2) {
      local_45 = TySimd128I4;
      bVar2 = newOpcode == Simd128_StSlot_I4;
    }
    else if (newOpcode == Simd128_LdSlot_I8) {
LAB_006905b9:
      local_45 = TySimd128I8;
      bVar2 = newOpcode == Simd128_StSlot_I8;
    }
    else if (newOpcode == Simd128_LdSlot_I16) {
LAB_006905d0:
      local_45 = TySimd128I16;
      bVar2 = newOpcode == Simd128_StSlot_I16;
    }
    else if ((ushort)(newOpcode - Simd128_LdSlot_F4) < 2) {
      local_45 = TySimd128F4;
      bVar2 = newOpcode == Simd128_StSlot_F4;
    }
    else {
      if (newOpcode == Simd128_StSlot_I8) goto LAB_006905b9;
      if ((ushort)(newOpcode - Simd128_LdSlot_U4) < 2) {
        local_45 = TySimd128U4;
        bVar2 = newOpcode == Simd128_StSlot_U4;
      }
      else if ((ushort)(newOpcode - Simd128_LdSlot_U8) < 2) {
        local_45 = TySimd128U8;
        bVar2 = newOpcode == Simd128_StSlot_U8;
      }
      else if ((ushort)(newOpcode - Simd128_LdSlot_U16) < 2) {
        local_45 = TySimd128U16;
        bVar2 = newOpcode == Simd128_StSlot_U16;
      }
      else {
        if (newOpcode == Simd128_StSlot_I16) goto LAB_006905d0;
        if ((ushort)(newOpcode - Simd128_LdSlot_B4) < 2) {
          local_45 = TySimd128B4;
          bVar2 = newOpcode == Simd128_StSlot_B4;
        }
        else if ((ushort)(newOpcode - Simd128_LdSlot_B8) < 2) {
          local_45 = TySimd128B8;
          bVar2 = newOpcode == Simd128_StSlot_B8;
        }
        else {
          if (1 < (ushort)(newOpcode - Simd128_LdSlot_B16)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                               ,0x55a,"((0))","(0)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
            goto LAB_0069079b;
          }
          local_45 = TySimd128B16;
          bVar2 = newOpcode == Simd128_StSlot_B16;
        }
      }
    }
    TStack_44 = SIMD;
    local_48.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         GetSimdValueTypeFromIRType(this,local_45);
  }
  RVar3 = GetRegSlotFromTypedReg(this,value,TStack_44);
  pSVar6 = BuildFieldOpnd(this,1,slotIndex,PropertyKindSlots,local_45,true);
  if (bVar2) {
    pRVar7 = BuildSrcOpnd(this,RVar3,local_45);
    IR::Opnd::SetValueType(&pRVar7->super_Opnd,(ValueType)local_48.field_0);
    _valueType = IR::Instr::New(StSlot,&pSVar6->super_Opnd,&pRVar7->super_Opnd,this->m_func);
  }
  else {
    pRVar7 = BuildDstOpnd(this,RVar3,local_45);
    IR::Opnd::SetValueType(&pRVar7->super_Opnd,(ValueType)local_48.field_0);
    _valueType = IR::Instr::New(LdSlot,&pRVar7->super_Opnd,&pSVar6->super_Opnd,this->m_func);
  }
LAB_0069079b:
  AddInstr(this,_valueType,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildElementSlot(Js::OpCodeAsmJs newOpcode, uint32 offset, int32 slotIndex, Js::RegSlot value, Js::RegSlot instance)
{
    Assert(OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode));

    Assert(instance == 1 || newOpcode == Js::OpCodeAsmJs::LdArr_Func || newOpcode == Js::OpCodeAsmJs::LdArr_WasmFunc);

    Js::RegSlot valueRegSlot;
    IR::Opnd * slotOpnd;
    IR::RegOpnd * regOpnd;
    IR::Instr * instr = nullptr;

    WAsmJs::Types type;
    IRType irType;
    ValueType valueType;
    bool isStore = false;

    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::LdSlot:
        valueRegSlot = GetRegSlotFromPtrReg(value);

        slotOpnd = BuildFieldOpnd(AsmJsRegSlots::ModuleMemReg, slotIndex, PropertyKindSlotArray, TyVar);

        regOpnd = BuildDstOpnd(valueRegSlot, TyMachReg);
        instr = IR::Instr::New(Js::OpCode::LdSlot, regOpnd, slotOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::LdSlotArr:
        valueRegSlot = GetRegSlotFromPtrReg(value);

        slotOpnd = BuildFieldOpnd(AsmJsRegSlots::ModuleMemReg, slotIndex, PropertyKindSlots, TyVar);

        regOpnd = BuildDstOpnd(valueRegSlot, TyMachReg);
        instr = IR::Instr::New(Js::OpCode::LdSlot, regOpnd, slotOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::LdArr_Func:
    {
        IR::RegOpnd * baseOpnd = BuildSrcOpnd(GetRegSlotFromPtrReg(instance), TyMachReg);
        IR::RegOpnd * indexOpnd = BuildSrcOpnd(GetRegSlotFromIntReg(slotIndex), TyUint32);

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(baseOpnd, indexOpnd, TyMachReg, m_func);

        regOpnd = BuildDstOpnd(GetRegSlotFromPtrReg(value), TyMachReg);
        instr = IR::Instr::New(Js::OpCode::LdAsmJsFunc, regOpnd, indirOpnd, m_func);
        break;
    }
    case Js::OpCodeAsmJs::LdArr_WasmFunc:
    {
        IR::RegOpnd * baseOpnd = BuildSrcOpnd(GetRegSlotFromPtrReg(instance), TyMachReg);
        IR::RegOpnd * indexOpnd = BuildSrcOpnd(GetRegSlotFromIntReg(slotIndex), TyUint32);

        regOpnd = BuildDstOpnd(GetRegSlotFromPtrReg(value), TyMachReg);
        instr = IR::Instr::New(Js::OpCode::LdWasmFunc, regOpnd, baseOpnd, indexOpnd, m_func);
        break;
    }
    case Js::OpCodeAsmJs::StSlot_Int:
    case Js::OpCodeAsmJs::LdSlot_Int:
        type = WAsmJs::INT32;
        irType = TyInt32;
        valueType = ValueType::GetInt(false);
        isStore = newOpcode == Js::OpCodeAsmJs::StSlot_Int;
        goto ProcessGenericSlot;

    case Js::OpCodeAsmJs::StSlot_Long:
    case Js::OpCodeAsmJs::LdSlot_Long:
        type = WAsmJs::INT64;
        irType = TyInt64;
        valueType = ValueType::GetInt(false);
        isStore = newOpcode == Js::OpCodeAsmJs::StSlot_Long;
        goto ProcessGenericSlot;

    case Js::OpCodeAsmJs::StSlot_Flt:
    case Js::OpCodeAsmJs::LdSlot_Flt:
        type = WAsmJs::FLOAT32;
        irType = TyFloat32;
        valueType = ValueType::Float;
        isStore = newOpcode == Js::OpCodeAsmJs::StSlot_Flt;
        goto ProcessGenericSlot;

    case Js::OpCodeAsmJs::StSlot_Db:
    case Js::OpCodeAsmJs::LdSlot_Db:
        type = WAsmJs::FLOAT64;
        irType = TyFloat64;
        valueType = ValueType::Float;
        isStore = newOpcode == Js::OpCodeAsmJs::StSlot_Db;
        goto ProcessGenericSlot;

    case Js::OpCodeAsmJs::Simd128_StSlot_I4:
    case Js::OpCodeAsmJs::Simd128_LdSlot_I4:
        irType = TySimd128I4;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_I4;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_B4:
    case Js::OpCodeAsmJs::Simd128_LdSlot_B4:
        irType = TySimd128B4;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_B4;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_B8:
    case Js::OpCodeAsmJs::Simd128_LdSlot_B8:
        irType = TySimd128B8;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_B8;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_B16:
    case Js::OpCodeAsmJs::Simd128_LdSlot_B16:
        irType = TySimd128B16;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_B16;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_F4:
    case Js::OpCodeAsmJs::Simd128_LdSlot_F4:
        irType = TySimd128F4;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_F4;
        goto ProcessSimdSlot;
#if 0
    case Js::OpCodeAsmJs::Simd128_StSlot_D2:
    case Js::OpCodeAsmJs::Simd128_LdSlot_D2:
        irType = TySimd128D2;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_D2;
        goto ProcessSimdSlot;
#endif // 0
    case Js::OpCodeAsmJs::Simd128_StSlot_I8:
    case Js::OpCodeAsmJs::Simd128_LdSlot_I8:
        irType = TySimd128I8;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_I8;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_I16:
    case Js::OpCodeAsmJs::Simd128_LdSlot_I16:
        irType = TySimd128I16;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_I16;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_U4:
    case Js::OpCodeAsmJs::Simd128_LdSlot_U4:
        irType = TySimd128U4;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_U4;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_U8:
    case Js::OpCodeAsmJs::Simd128_LdSlot_U8:
        irType = TySimd128U8;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_U8;
        goto ProcessSimdSlot;
    case Js::OpCodeAsmJs::Simd128_StSlot_U16:
    case Js::OpCodeAsmJs::Simd128_LdSlot_U16:
        irType = TySimd128U16;
        isStore = newOpcode == Js::OpCodeAsmJs::Simd128_StSlot_U16;
        goto ProcessSimdSlot;

    default:
        Assume(UNREACHED);
        break;
ProcessSimdSlot:
        type = WAsmJs::SIMD;
        valueType = GetSimdValueTypeFromIRType(irType);
ProcessGenericSlot:
        valueRegSlot = GetRegSlotFromTypedReg(value, type);
        slotOpnd = BuildFieldOpnd(AsmJsRegSlots::ModuleMemReg, slotIndex, PropertyKindSlots, irType);
        if (isStore)
        {
            regOpnd = BuildSrcOpnd(valueRegSlot, irType);
            regOpnd->SetValueType(valueType);
            instr = IR::Instr::New(Js::OpCode::StSlot, slotOpnd, regOpnd, m_func);
        }
        else
        {
            regOpnd = BuildDstOpnd(valueRegSlot, irType);
            regOpnd->SetValueType(valueType);
            instr = IR::Instr::New(Js::OpCode::LdSlot, regOpnd, slotOpnd, m_func);
        }
        break;
    }

    AddInstr(instr, offset);
}